

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine_c++.cpp
# Opt level: O3

int __thiscall Sine::open(Sine *this,char *__file,int __oflag,...)

{
  PaError PVar1;
  PaDeviceInfo *pPVar2;
  int device;
  PaStreamParameters outputParameters;
  PaStreamParameters local_40;
  
  device = (int)__file;
  if (device != -1) {
    local_40.device = device;
    pPVar2 = Pa_GetDeviceInfo(device);
    if (pPVar2 != (PaDeviceInfo *)0x0) {
      printf("Output device name: \'%s\'\r");
    }
    local_40.channelCount = 2;
    local_40.sampleFormat = 1;
    pPVar2 = Pa_GetDeviceInfo(device);
    local_40.suggestedLatency = pPVar2->defaultLowOutputLatency;
    local_40.hostApiSpecificStreamInfo = (void *)0x0;
    PVar1 = Pa_OpenStream(&this->stream,(PaStreamParameters *)0x0,&local_40,44100.0,0,1,paCallback,
                          this);
    if (PVar1 != 0) {
      return 0;
    }
    PVar1 = Pa_SetStreamFinishedCallback(this->stream,paStreamFinished);
    if (PVar1 == 0) {
      return 1;
    }
    Pa_CloseStream(this->stream);
    this->stream = (PaStream *)0x0;
  }
  return 0;
}

Assistant:

bool open(PaDeviceIndex index)
    {
        PaStreamParameters outputParameters;

        outputParameters.device = index;
        if (outputParameters.device == paNoDevice) {
            return false;
        }

        const PaDeviceInfo* pInfo = Pa_GetDeviceInfo(index);
        if (pInfo != 0)
        {
            printf("Output device name: '%s'\r", pInfo->name);
        }

        outputParameters.channelCount = 2;       /* stereo output */
        outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
        outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
        outputParameters.hostApiSpecificStreamInfo = NULL;

        PaError err = Pa_OpenStream(
            &stream,
            NULL, /* no input */
            &outputParameters,
            SAMPLE_RATE,
            paFramesPerBufferUnspecified,
            paClipOff,      /* we won't output out of range samples so don't bother clipping them */
            &Sine::paCallback,
            this            /* Using 'this' for userData so we can cast to Sine* in paCallback method */
            );

        if (err != paNoError)
        {
            /* Failed to open stream to device !!! */
            return false;
        }

        err = Pa_SetStreamFinishedCallback( stream, &Sine::paStreamFinished );

        if (err != paNoError)
        {
            Pa_CloseStream( stream );
            stream = 0;

            return false;
        }

        return true;
    }